

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint ucvector_reserve(ucvector *p,size_t allocsize)

{
  uchar *puVar1;
  uint uVar2;
  ulong __size;
  
  uVar2 = 1;
  if (p->allocsize < allocsize) {
    __size = allocsize * 3 >> 1;
    if (p->allocsize * 2 < allocsize) {
      __size = allocsize;
    }
    puVar1 = (uchar *)realloc(p->data,__size);
    if (puVar1 == (uchar *)0x0) {
      uVar2 = 0;
    }
    else {
      p->allocsize = __size;
      p->data = puVar1;
    }
  }
  return uVar2;
}

Assistant:

static unsigned ucvector_reserve(ucvector* p, size_t allocsize)
{
	if (allocsize > p->allocsize)
	{
		size_t newsize = (allocsize > p->allocsize * 2) ? allocsize : (allocsize * 3 / 2);
		void* data = lodepng_realloc(p->data, newsize);
		if (data)
		{
			p->allocsize = newsize;
			p->data = (unsigned char*)data;
		}
		else return 0; /*error: not enough memory*/
	}
	return 1;
}